

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceStringsWrapper.cpp
# Opt level: O0

void * __thiscall ResString::getFieldPtr(ResString *this,size_t fId,size_t subField)

{
  Executable *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong local_50;
  WORD *content;
  bufsize_t size;
  size_t subField_local;
  size_t fId_local;
  ResString *this_local;
  
  if (fId == 0) {
    this_local = (ResString *)this->sizePtr;
  }
  else if (fId == 1) {
    if (this->sizePtr == (WORD *)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = (ulong)*this->sizePtr;
    }
    pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                      (pEVar1,this->offset,1,local_50,0);
    this_local = (ResString *)CONCAT44(extraout_var,iVar2);
  }
  else {
    iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0xc])();
    this_local = (ResString *)CONCAT44(extraout_var_00,iVar2);
  }
  return this_local;
}

Assistant:

void* ResString::getFieldPtr(size_t fId, size_t subField)
{
    switch (fId) {
        case STR_LEN: return this->sizePtr;
        case WSTRING:
        {
            bufsize_t size = (sizePtr == NULL) ? 0 : static_cast<bufsize_t>(*sizePtr);
            WORD *content = (WORD*) this->m_Exe->getContentAt(offset,Executable::RAW, size);
            return content;
        }
    }
    return this->getPtr();
}